

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O0

void tar_mode_r(bsdtar *bsdtar)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  archive *paVar7;
  char *pcVar8;
  int64_t __offset;
  __off_t _Var9;
  archive *in_RDI;
  undefined8 in_R9;
  bsdtar *in_stack_00000008;
  archive *in_stack_00000010;
  int r;
  archive_entry *entry;
  archive *a;
  int format;
  int64_t end_offset;
  size_t in_stack_00000058;
  int in_stack_00000064;
  archive *in_stack_00000068;
  archive *in_stack_ffffffffffffffb8;
  archive *paVar10;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  archive *in_stack_ffffffffffffffc8;
  undefined8 uVar11;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar12;
  uint local_14;
  
  test_for_append(bsdtar);
  local_14 = 0x30003;
  iVar3 = open(*(char **)in_RDI,0x42,0x1b6);
  *(int *)&in_RDI[1].archive_format_name = iVar3;
  if (*(int *)&in_RDI[1].archive_format_name < 0) {
    puVar6 = (uint *)__errno_location();
    uVar1._0_4_ = in_RDI->magic;
    uVar1._4_4_ = in_RDI->state;
    lafe_errc(1,(int)(ulong)*puVar6,"Cannot open %s",uVar1);
  }
  paVar7 = archive_read_new();
  archive_read_support_filter_all(in_stack_ffffffffffffffb8);
  archive_read_support_format_empty(in_RDI);
  archive_read_support_format_tar(in_RDI);
  archive_read_support_format_gnutar(in_stack_ffffffffffffffb8);
  set_reader_options((bsdtar *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  iVar3 = archive_read_open_fd(in_stack_00000068,in_stack_00000064,in_stack_00000058);
  if (iVar3 != 0) {
    uVar4 = archive_errno(paVar7);
    uVar11._0_4_ = in_RDI->magic;
    uVar11._4_4_ = in_RDI->state;
    pcVar8 = archive_error_string(paVar7);
    lafe_errc(1,(int)(ulong)uVar4,"Can\'t read archive %s: %s",uVar11,pcVar8);
  }
  uVar12 = 0;
  while (iVar3 = archive_read_next_header
                           ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                            ,(archive_entry **)in_stack_ffffffffffffffb8), iVar3 == 0) {
    iVar3 = archive_filter_code((archive *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    if (iVar3 != 0) {
      archive_read_free((archive *)0x11509f);
      close(*(int *)&in_RDI[1].archive_format_name);
      lafe_errc(1,0,"Cannot append to compressed archive.");
    }
    local_14 = archive_format(paVar7);
  }
  __offset = archive_read_header_position(in_stack_ffffffffffffffc8);
  archive_read_free((archive *)0x1150ed);
  paVar7 = archive_write_new();
  pcVar8 = cset_get_format(*(creation_set **)(in_RDI + 1));
  if (pcVar8 == (char *)0x0) {
    archive_write_set_format(in_stack_ffffffffffffffb8,0);
  }
  else {
    paVar10 = paVar7;
    cset_get_format(*(creation_set **)(in_RDI + 1));
    archive_write_set_format_by_name
              (in_stack_ffffffffffffffc8,
               (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    uVar4 = local_14 & 0xff0000;
    uVar5 = archive_format(paVar7);
    if ((uVar4 != (uVar5 & 0xff0000)) && ((local_14 & 0xff0000) != 0x60000)) {
      pcVar8 = cset_get_format(*(creation_set **)(in_RDI + 1));
      uVar2._0_4_ = in_RDI->magic;
      uVar2._4_4_ = in_RDI->state;
      lafe_errc(1,0,"Format %s is incompatible with the archive %s.",pcVar8,uVar2,in_R9,paVar10);
    }
  }
  _Var9 = lseek(*(int *)&in_RDI[1].archive_format_name,__offset,0);
  if (_Var9 < 0) {
    puVar6 = (uint *)__errno_location();
    lafe_errc(1,(int)(ulong)*puVar6,"Could not seek to archive end");
  }
  set_writer_options((bsdtar *)CONCAT44(uVar12,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8)
  ;
  iVar3 = archive_write_open_fd(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  if (iVar3 != 0) {
    pcVar8 = archive_error_string(paVar7);
    lafe_errc(1,0,"%s",pcVar8);
  }
  write_archive(in_stack_00000010,in_stack_00000008);
  close(*(int *)&in_RDI[1].archive_format_name);
  *(undefined4 *)&in_RDI[1].archive_format_name = 0xffffffff;
  return;
}

Assistant:

void
tar_mode_r(struct bsdtar *bsdtar)
{
	int64_t	end_offset;
	int	format;
	struct archive *a;
	struct archive_entry *entry;
	int	r;

	/* Sanity-test some arguments and the file. */
	test_for_append(bsdtar);

	format = ARCHIVE_FORMAT_TAR_PAX_RESTRICTED;

#if defined(__BORLANDC__)
	bsdtar->fd = open(bsdtar->filename, O_RDWR | O_CREAT | O_BINARY);
#else
	bsdtar->fd = open(bsdtar->filename, O_RDWR | O_CREAT | O_BINARY, 0666);
#endif
	if (bsdtar->fd < 0)
		lafe_errc(1, errno,
		    "Cannot open %s", bsdtar->filename);

	a = archive_read_new();
	archive_read_support_filter_all(a);
	archive_read_support_format_empty(a);
	archive_read_support_format_tar(a);
	archive_read_support_format_gnutar(a);
	set_reader_options(bsdtar, a);
	r = archive_read_open_fd(a, bsdtar->fd, 10240);
	if (r != ARCHIVE_OK)
		lafe_errc(1, archive_errno(a),
		    "Can't read archive %s: %s", bsdtar->filename,
		    archive_error_string(a));
	while (0 == archive_read_next_header(a, &entry)) {
		if (archive_filter_code(a, 0) != ARCHIVE_FILTER_NONE) {
			archive_read_free(a);
			close(bsdtar->fd);
			lafe_errc(1, 0,
			    "Cannot append to compressed archive.");
		}
		/* Keep going until we hit end-of-archive */
		format = archive_format(a);
	}

	end_offset = archive_read_header_position(a);
	archive_read_free(a);

	/* Re-open archive for writing */
	a = archive_write_new();
	/*
	 * Set the format to be used for writing.  To allow people to
	 * extend empty files, we need to allow them to specify the format,
	 * which opens the possibility that they will specify a format that
	 * doesn't match the existing format.  Hence, the following bit
	 * of arcane ugliness.
	 */

	if (cset_get_format(bsdtar->cset) != NULL) {
		/* If the user requested a format, use that, but ... */
		archive_write_set_format_by_name(a,
		    cset_get_format(bsdtar->cset));
		/* ... complain if it's not compatible. */
		format &= ARCHIVE_FORMAT_BASE_MASK;
		if (format != (int)(archive_format(a) & ARCHIVE_FORMAT_BASE_MASK)
		    && format != ARCHIVE_FORMAT_EMPTY) {
			lafe_errc(1, 0,
			    "Format %s is incompatible with the archive %s.",
			    cset_get_format(bsdtar->cset), bsdtar->filename);
		}
	} else {
		/*
		 * Just preserve the current format, with a little care
		 * for formats that libarchive can't write.
		 */
		if (format == ARCHIVE_FORMAT_EMPTY)
			format = ARCHIVE_FORMAT_TAR_PAX_RESTRICTED;
		archive_write_set_format(a, format);
	}
	if (lseek(bsdtar->fd, end_offset, SEEK_SET) < 0)
		lafe_errc(1, errno, "Could not seek to archive end");
	set_writer_options(bsdtar, a);
	if (ARCHIVE_OK != archive_write_open_fd(a, bsdtar->fd))
		lafe_errc(1, 0, "%s", archive_error_string(a));

	write_archive(a, bsdtar); /* XXX check return val XXX */

	close(bsdtar->fd);
	bsdtar->fd = -1;
}